

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::ToVar(GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *bv,BasicBlock *block,
              Instr *insertBeforeInstr)

{
  Type TVar1;
  BasicBlock *pBVar2;
  Opnd *pOVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  undefined4 *puVar7;
  StackSym *sym;
  RegOpnd *regOpnd;
  Func **ppFVar8;
  long lVar9;
  Type_conflict pBVar10;
  Instr *this_00;
  ulong uVar11;
  ulong uVar12;
  
  pBVar10 = bv->head;
  if (pBVar10 != (Type_conflict)0x0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar11 = (pBVar10->data).word;
      if (uVar11 != 0) {
        TVar1 = pBVar10->startIndex;
        uVar12 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
          sym = SymTable::FindStackSym(this->func->m_symTable,TVar1 + (BVIndex)uVar12);
          regOpnd = IR::RegOpnd::New(sym,TyVar,this->func);
          pBVar2 = block->next;
          ppFVar8 = (Func **)&pBVar2->firstInstr;
          if (pBVar2 == (BasicBlock *)0x0) {
            ppFVar8 = &block->func;
          }
          lVar9 = 0x18;
          if (pBVar2 == (BasicBlock *)0x0) {
            lVar9 = 0xd0;
          }
          this_00 = insertBeforeInstr;
          if (insertBeforeInstr == (Instr *)0x0) {
            this_00 = *(Instr **)((long)&(*ppFVar8)->m_alloc + lVar9);
            if ((this_00->m_kind == InstrKindBranch) || (this_00->m_opcode == BailTarget)) {
              pOVar3 = this_00->m_src1;
              if (pOVar3 != (Opnd *)0x0) {
                OVar5 = IR::Opnd::GetKind(pOVar3);
                if (OVar5 == OpndKindReg) {
                  OVar5 = IR::Opnd::GetKind(pOVar3);
                  if (OVar5 != OpndKindReg) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                    if (!bVar6) goto LAB_0043ba6c;
                    *puVar7 = 0;
                  }
                  if ((StackSym *)pOVar3[1]._vptr_Opnd == sym) {
                    IR::Instr::HoistSrc1(this_00,Ld_A,RegNOREG,(StackSym *)0x0);
                  }
                }
                pOVar3 = this_00->m_src2;
                if ((pOVar3 != (Opnd *)0x0) &&
                   (OVar5 = IR::Opnd::GetKind(pOVar3), OVar5 == OpndKindReg)) {
                  OVar5 = IR::Opnd::GetKind(pOVar3);
                  if (OVar5 != OpndKindReg) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                    if (!bVar6) {
LAB_0043ba6c:
                      pcVar4 = (code *)invalidInstructionException();
                      (*pcVar4)();
                    }
                    *puVar7 = 0;
                  }
                  if ((StackSym *)pOVar3[1]._vptr_Opnd == sym) {
                    IR::Instr::HoistSrc2(this_00,Ld_A,RegNOREG,(StackSym *)0x0);
                  }
                }
              }
            }
            else {
              this_00 = this_00->m_next;
            }
          }
          ToVar(this,this_00,regOpnd,block,(Value *)0x0,false);
          uVar11 = uVar11 & ~(1L << (uVar12 & 0x3f));
          uVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
        } while (uVar11 != 0);
      }
      pBVar10 = pBVar10->next;
    } while (pBVar10 != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::ToVar(BVSparse<JitArenaAllocator> *bv, BasicBlock *block, IR::Instr* insertBeforeInstr /* = nullptr */)
{
    FOREACH_BITSET_IN_SPARSEBV(id, bv)
    {
        StackSym *stackSym = this->func->m_symTable->FindStackSym(id);
        IR::RegOpnd *newOpnd = IR::RegOpnd::New(stackSym, TyVar, this->func);
        IR::Instr* lastInstr = block->GetLastInstr();

        if (insertBeforeInstr != nullptr)
        {
            this->ToVar(insertBeforeInstr, newOpnd, block, nullptr, false);
        }
        else if (lastInstr->IsBranchInstr() || lastInstr->m_opcode == Js::OpCode::BailTarget)
        {
            // If branch is using this symbol, hoist the operand as the ToVar load will get
            // inserted right before the branch.
            IR::Opnd *src1 = lastInstr->GetSrc1();
            if (src1)
            {
                if (src1->IsRegOpnd() && src1->AsRegOpnd()->m_sym == stackSym)
                {
                    lastInstr->HoistSrc1(Js::OpCode::Ld_A);
                }
                IR::Opnd *src2 = lastInstr->GetSrc2();
                if (src2)
                {
                    if (src2->IsRegOpnd() && src2->AsRegOpnd()->m_sym == stackSym)
                    {
                        lastInstr->HoistSrc2(Js::OpCode::Ld_A);
                    }
                }
            }
            this->ToVar(lastInstr, newOpnd, block, nullptr, false);
        }
        else
        {
            IR::Instr *lastNextInstr = lastInstr->m_next;
            this->ToVar(lastNextInstr, newOpnd, block, nullptr, false);
        }
    } NEXT_BITSET_IN_SPARSEBV;
}